

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauss_pyramid.h
# Opt level: O3

void gimage::reduceGauss<unsigned_char,unsigned_char>
               (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *target,
               Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *image)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  byte *pbVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  uchar *puVar10;
  float *pfVar11;
  long lVar12;
  long lVar13;
  float fVar14;
  ImageFloat tmp;
  int local_7c;
  long local_70;
  Image<float,_gimage::PixelTraits<float>_> local_68;
  
  local_68.depth = 0;
  local_68.width = 0;
  local_68.height = 0;
  local_68.n = 0;
  local_68.pixel = (float *)0x0;
  local_68.row = (float **)0x0;
  local_68.img = (float ***)0x0;
  Image<float,_gimage::PixelTraits<float>_>::setSize
            (&local_68,(image->width - (image->width + 1 >> 0x3f)) + 1 >> 1,image->height,1);
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize
            (target,(image->width - (image->width + 1 >> 0x3f)) + 1 >> 1,
             (image->height - (image->height + 1 >> 0x3f)) + 1 >> 1,(long)image->depth);
  local_7c = image->depth;
  if (0 < local_7c) {
    local_70 = 0;
    do {
      lVar8 = image->height;
      if (0 < lVar8) {
        pfVar11 = **local_68.img;
        lVar9 = image->width;
        lVar13 = 0;
        do {
          if (0 < lVar9) {
            puVar10 = image->img[local_70][lVar13];
            lVar7 = 0;
            do {
              if (lVar7 == 0 || lVar9 + -2 <= lVar7) {
                fVar14 = 0.0;
                lVar12 = 0;
                lVar6 = lVar7;
                do {
                  lVar3 = 2;
                  if (2 < lVar6) {
                    lVar3 = lVar6;
                  }
                  lVar4 = lVar3 + -2;
                  if (lVar9 + -1 <= lVar3 + -2) {
                    lVar4 = lVar9 + -1;
                  }
                  fVar14 = fVar14 + (float)puVar10[lVar4] *
                                    *(float *)((long)reduceGauss<unsigned_char,_unsigned_char>::g +
                                              lVar12);
                  lVar12 = lVar12 + 4;
                  lVar6 = lVar6 + 1;
                } while (lVar12 != 0x14);
              }
              else {
                pbVar5 = puVar10 + lVar7 + -2;
                fVar14 = 0.0;
                lVar6 = 0;
                do {
                  bVar1 = *pbVar5;
                  pbVar5 = pbVar5 + 1;
                  fVar14 = fVar14 + (float)bVar1 *
                                    *(float *)((long)reduceGauss<unsigned_char,_unsigned_char>::g +
                                              lVar6);
                  lVar6 = lVar6 + 4;
                } while (lVar6 != 0x14);
              }
              *pfVar11 = fVar14;
              pfVar11 = pfVar11 + 1;
              lVar7 = lVar7 + 2;
            } while (lVar7 < lVar9);
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 != lVar8);
      }
      if (0 < local_68.width) {
        lVar8 = 0;
        lVar9 = 0;
        do {
          if (0 < local_68.height) {
            puVar10 = *target->img[local_70] + lVar9;
            lVar13 = 0;
            do {
              if ((lVar13 == 0) || (local_68.height + -2 <= lVar13)) {
                lVar7 = local_68.width + -1;
                if (lVar9 < local_68.width + -1) {
                  lVar7 = lVar9;
                }
                iVar2 = local_68.depth;
                if (0 < local_68.depth) {
                  iVar2 = 1;
                }
                fVar14 = 0.0;
                lVar12 = 0;
                lVar6 = lVar13;
                do {
                  lVar3 = 2;
                  if (2 < lVar6) {
                    lVar3 = lVar6;
                  }
                  lVar4 = lVar3 + -2;
                  if (local_68.height + -1 <= lVar3 + -2) {
                    lVar4 = local_68.height + -1;
                  }
                  fVar14 = fVar14 + *(float *)((long)reduceGauss<unsigned_char,_unsigned_char>::g +
                                              lVar12) * local_68.img[(long)iVar2 + -1][lVar4][lVar7]
                  ;
                  lVar12 = lVar12 + 4;
                  lVar6 = lVar6 + 1;
                } while (lVar12 != 0x14);
              }
              else {
                pfVar11 = (float *)((long)(*local_68.img)[lVar13 + -2] + lVar8);
                fVar14 = 0.0;
                lVar7 = 0;
                do {
                  fVar14 = fVar14 + *(float *)((long)reduceGauss<unsigned_char,_unsigned_char>::g +
                                              lVar7) * *pfVar11;
                  lVar7 = lVar7 + 4;
                  pfVar11 = pfVar11 + local_68.width;
                } while (lVar7 != 0x14);
              }
              *puVar10 = (uchar)(int)fVar14;
              puVar10 = puVar10 + target->width;
              lVar13 = lVar13 + 2;
            } while (lVar13 < local_68.height);
          }
          lVar9 = lVar9 + 1;
          lVar8 = lVar8 + 4;
        } while (lVar9 < local_68.width);
        local_7c = image->depth;
      }
      local_70 = local_70 + 1;
    } while (local_70 < local_7c);
  }
  Image<float,_gimage::PixelTraits<float>_>::~Image(&local_68);
  return;
}

Assistant:

void reduceGauss(Image<T> &target, const Image<S> &image)
{
  static const float g[]={0.0625, 0.25, 0.375, 0.25, 0.0625};

  // intermediate image with downscaled width

  ImageFloat tmp((image.getWidth()+1)/2, image.getHeight(), 1);

  // downscaled target image

  target.setSize((image.getWidth()+1)/2, (image.getHeight()+1)/2, image.getDepth());

  // for all color channels

  for (int d=0; d<image.getDepth(); d++)
  {
    // convolve horizontal into horizontally downscaled intermediate image

    float *tmpp=tmp.getPtr(0, 0, 0);
    for (long k=0; k<image.getHeight(); k++)
    {
      for (long i=0; i<image.getWidth(); i+=2)
      {
        float pv=0;

        if (i >= 2 && i < image.getWidth()-2)
        {
          S *p=image.getPtr(i-2, k, d);
          for (long j=0; j<5; j++)
          {
            pv+=g[j]* *p++;
          }
        }
        else
        {
          for (long j=0; j<5; j++)
          {
            pv+=g[j]*image.getBounds(i+j-2, k, d);
          }
        }

        *tmpp++=pv;
      }
    }

    // convolve vertically into downscaled target image

    for (long i=0; i<tmp.getWidth(); i++)
    {
      T *tp=target.getPtr(i, 0, d);
      for (long k=0; k<tmp.getHeight(); k+=2)
      {
        float pv=0;

        if (k >= 2 && k < tmp.getHeight()-2)
        {
          float *p=tmp.getPtr(i, k-2, 0);
          for (long j=0; j<5; j++)
          {
            pv+=g[j]* *p;
            p+=tmp.getWidth();
          }
        }
        else
        {
          for (long j=0; j<5; j++)
          {
            pv+=g[j]*tmp.getBounds(i, k+j-2, 0);
          }
        }

        *tp=static_cast<T>(pv);
        tp+=target.getWidth();
      }
    }
  }
}